

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

void processSpilledTemps(AssemblyCommands *commands,
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *tempToColorMap,RegisterInfo *registerInfo)

{
  size_t *this;
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
  local_c0;
  const_iterator local_b8;
  shared_ptr<AssemblyCode::AssemblyCommand> local_b0;
  undefined1 local_a0 [8];
  shared_ptr<AssemblyCode::AssemblyCommand> command;
  iterator __end1;
  iterator __begin1;
  AssemblyCommands *__range1;
  undefined1 local_68 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  spilledToOffset;
  AssemblyCommands newAssemblyCommands;
  RegisterInfo *registerInfo_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *tempToColorMap_local;
  AssemblyCommands *commands_local;
  
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::vector((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            *)&spilledToOffset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  buildSpillToOffsetMap
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_68,tempToColorMap);
  __end1 = std::
           vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           ::begin(commands);
  command.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
          ::end(commands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
                                *)&command.
                                   super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_a0,psVar2);
    peVar3 = std::
             __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr
              (&local_b0,(shared_ptr<AssemblyCode::AssemblyCommand> *)local_a0);
    (*peVar3->_vptr_AssemblyCommand[4])
              (peVar3,&local_b0,&spilledToOffset._M_t._M_impl.super__Rb_tree_header._M_node_count,
               local_68,&registerInfo->spBeginReg);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr(&local_b0);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_a0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::clear(commands);
  local_c0._M_current =
       (shared_ptr<AssemblyCode::AssemblyCommand> *)
       std::
       vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       ::end(commands);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
  ::__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>*>
            ((__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
              *)&local_b8,&local_c0);
  this = &spilledToOffset._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first = std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            ::begin((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                     *)this);
  __last = std::
           vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           ::end((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  *)this);
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>,void>
            ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
              *)commands,local_b8,
             (__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
              )__last._M_current);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_68);
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::~vector((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             *)&spilledToOffset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void processSpilledTemps(AssemblyCommands& commands,
        std::map<std::string, int>& tempToColorMap,
        AssemblyCode::RegisterInfo& registerInfo) {

    AssemblyCommands newAssemblyCommands;
    std::map<std::string, int> spilledToOffset = buildSpillToOffsetMap(tempToColorMap);
    for (auto command : commands) {
        command->processMemoryTemps(command, newAssemblyCommands, spilledToOffset, registerInfo.spBeginReg);
    }

    commands.clear();
    commands.insert(commands.end(), newAssemblyCommands.begin(), newAssemblyCommands.end());
}